

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_random.hpp
# Opt level: O0

result_type __thiscall iutest::detail::iuRandom::genrand(iuRandom *this,uint max)

{
  result_type rVar1;
  uniform_int_distribution<unsigned_int> local_1c;
  uniform_int_distribution<unsigned_int> d;
  uint max_local;
  iuRandom *this_local;
  
  d._M_param._M_a = max;
  unique0x1000004a = this;
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution(&local_1c,0,max - 1);
  rVar1 = std::uniform_int_distribution<unsigned_int>::operator()(&local_1c,&this->m_engine);
  return rVar1;
}

Assistant:

result_type genrand(unsigned int max)
    {
#if IUTEST_HAS_CXX_HDR_RANDOM
        ::std::uniform_int_distribution<unsigned int> d(0, max-1);
        return d(m_engine);
#else
        return genrand()%max;
#endif
    }